

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream_writer.hpp
# Opt level: O0

void __thiscall BitstreamWriter::add_bit(BitstreamWriter *this,bool bit)

{
  size_type sVar1;
  byte *pbVar2;
  uint8_t base_value;
  uint8_t *last_byte;
  BitstreamWriter *pBStack_10;
  bool bit_local;
  BitstreamWriter *this_local;
  
  last_byte._7_1_ = bit;
  pBStack_10 = this;
  if (this->_bit_position == '\b') {
    last_byte._0_4_ = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<int>
              (&this->_bytes,(int *)&last_byte);
    this->_bit_position = '\0';
  }
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_bytes);
  pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->_bytes,sVar1 - 1);
  *pbVar2 = *pbVar2 | ((last_byte._7_1_ & 1) != 0) << (7U - this->_bit_position & 0x1f);
  this->_bit_position = this->_bit_position + '\x01';
  return;
}

Assistant:

void add_bit(bool bit)
    {
        if(_bit_position == 8)
        {
            _bytes.emplace_back(0);
            _bit_position = 0;
        }

        uint8_t& last_byte = _bytes[_bytes.size()-1];
        uint8_t base_value = (bit) ? 1 : 0;
        last_byte |= (base_value << (7 - _bit_position));
        _bit_position += 1;
    }